

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

Request<capnp::AnyPointer,_capnp::AnyPointer> * __thiscall
capnp::QueuedClient::newCall
          (Request<capnp::AnyPointer,_capnp::AnyPointer> *__return_storage_ptr__,QueuedClient *this,
          uint64_t interfaceId,uint16_t methodId,Maybe<capnp::MessageSize> *sizeHint)

{
  Builder builder;
  LocalRequest *pLVar1;
  MallocMessageBuilder *this_00;
  Own<capnp::LocalRequest> *other;
  Own<capnp::RequestHook> local_a8;
  SegmentBuilder *local_98;
  SegmentBuilder *pSStack_90;
  WirePointer *local_88;
  undefined1 auStack_78 [8];
  Builder root;
  Own<capnp::QueuedClient> local_50;
  undefined1 local_40 [8];
  Own<capnp::LocalRequest> hook;
  Maybe<capnp::MessageSize> *sizeHint_local;
  uint64_t uStack_20;
  uint16_t methodId_local;
  uint64_t interfaceId_local;
  QueuedClient *this_local;
  
  hook.ptr = (LocalRequest *)sizeHint;
  sizeHint_local._6_2_ = methodId;
  uStack_20 = interfaceId;
  interfaceId_local = (uint64_t)this;
  this_local = (QueuedClient *)__return_storage_ptr__;
  kj::addRef<capnp::QueuedClient>((kj *)&local_50,this);
  kj::
  heap<capnp::LocalRequest,unsigned_long&,unsigned_short&,kj::Maybe<capnp::MessageSize>&,kj::Own<capnp::QueuedClient>>
            ((kj *)local_40,&stack0xffffffffffffffe0,(unsigned_short *)((long)&sizeHint_local + 6),
             sizeHint,&local_50);
  kj::Own<capnp::QueuedClient>::~Own(&local_50);
  pLVar1 = kj::Own<capnp::LocalRequest>::operator->((Own<capnp::LocalRequest> *)local_40);
  this_00 = kj::Own<capnp::MallocMessageBuilder>::operator->(&pLVar1->message);
  MessageBuilder::getRoot<capnp::AnyPointer>((Builder *)auStack_78,&this_00->super_MessageBuilder);
  local_88 = (WirePointer *)root.builder.capTable;
  local_98 = (SegmentBuilder *)auStack_78;
  pSStack_90 = root.builder.segment;
  other = kj::mv<kj::Own<capnp::LocalRequest>>((Own<capnp::LocalRequest> *)local_40);
  kj::Own<capnp::RequestHook>::Own<capnp::LocalRequest,void>(&local_a8,other);
  builder.builder.capTable = (CapTableBuilder *)pSStack_90;
  builder.builder.segment = local_98;
  builder.builder.pointer = local_88;
  Request<capnp::AnyPointer,_capnp::AnyPointer>::Request(__return_storage_ptr__,builder,&local_a8);
  kj::Own<capnp::RequestHook>::~Own(&local_a8);
  kj::Own<capnp::LocalRequest>::~Own((Own<capnp::LocalRequest> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Request<AnyPointer, AnyPointer> newCall(
      uint64_t interfaceId, uint16_t methodId, kj::Maybe<MessageSize> sizeHint) override {
    auto hook = kj::heap<LocalRequest>(
        interfaceId, methodId, sizeHint, kj::addRef(*this));
    auto root = hook->message->getRoot<AnyPointer>();
    return Request<AnyPointer, AnyPointer>(root, kj::mv(hook));
  }